

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void vrna_md_set_nonstandards(vrna_md_t *md,char *ns_bases)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  int local_28;
  int sym;
  int i;
  uint n;
  char *c;
  char *ns_bases_local;
  vrna_md_t *md_local;
  
  if (md != (vrna_md_t *)0x0) {
    if (ns_bases == (char *)0x0) {
      md->nonstandards[0] = '\0';
      free(nonstandards);
      nonstandards = (char *)0x0;
    }
    else {
      sVar2 = strlen(ns_bases);
      if ((uint)sVar2 < 0x21) {
        local_28 = 0;
        cVar1 = *ns_bases;
        _i = ns_bases;
        if (cVar1 == '-') {
          _i = ns_bases + 1;
        }
        for (; *_i != '\0'; _i = _i + 1) {
          iVar4 = local_28;
          pcVar3 = _i;
          if (*_i != ',') {
            pcVar3 = _i + 1;
            md->nonstandards[local_28] = *_i;
            iVar4 = local_28 + 2;
            md->nonstandards[local_28 + 1] = *pcVar3;
            if ((cVar1 == '-') && (*pcVar3 != *_i)) {
              md->nonstandards[iVar4] = *pcVar3;
              md->nonstandards[local_28 + 3] = *_i;
              iVar4 = local_28 + 4;
            }
          }
          _i = pcVar3;
          local_28 = iVar4;
        }
        md->nonstandards[local_28] = '\0';
        free(nonstandards);
        nonstandards = (char *)vrna_alloc(0x21);
        memcpy(nonstandards,md->nonstandards,0x21);
      }
      else {
        vrna_message_warning("vrna_md_set_nonstandards: list too long, dropping nonstandards!");
      }
    }
    vrna_md_update(md);
  }
  return;
}

Assistant:

PUBLIC void
vrna_md_set_nonstandards(vrna_md_t  *md,
                         const char *ns_bases)
{
  const char    *c;
  unsigned int  n;
  int           i, sym;

  if (md) {
    if (ns_bases) {
      n = strlen(ns_bases);
      if (n < 33) {
        /* parse the ns_bases list */
        c = ns_bases;
        i = sym = 0;
        if (*c == '-') {
          sym = 1;
          c++;
        }

        while (*c != '\0') {
          if (*c != ',') {
            md->nonstandards[i++] = *c++;
            md->nonstandards[i++] = *c;
            if ((sym) && (*c != *(c - 1))) {
              md->nonstandards[i++] = *c;
              md->nonstandards[i++] = *(c - 1);
            }
          }

          c++;
        }
        md->nonstandards[i] = '\0';

#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
        free(nonstandards);
        nonstandards = vrna_alloc(33);
        memcpy(nonstandards, &(md->nonstandards[0]), 33 * sizeof(char));
#endif
      } else {
        vrna_message_warning("vrna_md_set_nonstandards: list too long, dropping nonstandards!");
      }
    } else {
      /* remove nonstandards */
      md->nonstandards[0] = '\0';
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
      free(nonstandards);
      nonstandards = NULL;
#endif
    }

    /* update pair/rtype/alias arrays accordingly */
    vrna_md_update(md);
  }
}